

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
               (CodedInputStream *input,int32_t *value)

{
  bool bVar1;
  uint32_t temp;
  uint local_c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_c);
  if (bVar1) {
    *value = -(local_c & 1) ^ local_c >> 1;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32_t, WireFormatLite::TYPE_SINT32>(
    io::CodedInputStream* input, int32_t* value) {
  uint32_t temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = ZigZagDecode32(temp);
  return true;
}